

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

void mwAbort(void)

{
  mwData **ppmVar1;
  uint uVar2;
  mwMarker *pmVar3;
  bool bVar4;
  int iVar5;
  uchar *ptr_1;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  __int32_t **pp_Var9;
  mwData *pmVar10;
  ulong uVar11;
  char *pcVar12;
  mwStat *pmVar13;
  uchar *ptr;
  ulong uVar14;
  char cVar15;
  ulong uVar16;
  char *pcVar17;
  mwStat *pmVar18;
  time_t tid;
  time_t local_38;
  
  local_38 = time((time_t *)0x0);
  ctime(&local_38);
  mwWrite("\nStopped at %s\n");
  if (mwInited == 0) {
    mwWrite("internal: mwAbort(): MEMWATCH not initialized!\n");
  }
  if (mwTestAlways != 0) {
    mwTestNow((char *)0x0,0,1);
  }
  mwDrop_(0,0xfb,0);
  mwDrop_(0,0xfc,0);
  if (mwGrabList != (mwGrabData *)0x0) {
    mwWrite("internal: the grab list is not empty after mwDropAll()\n");
  }
  while (mwFirstMark != (mwMarker *)0x0) {
    pmVar3 = mwFirstMark->next;
    mwWrite("mark: %p: %s\n",mwFirstMark->host,mwFirstMark->text);
    free(mwFirstMark->text);
    free(mwFirstMark);
    mwErrors = mwErrors + 1;
    mwFirstMark = pmVar3;
  }
  mwFirstMark = (mwMarker *)0x0;
  if (mwHead != (mwData *)0x0) {
    uVar2 = 0;
    do {
      while (iVar5 = mwIsOwned(mwHead,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/memwatch.c"
                               ,0x230), iVar5 == 0) {
        mwWrite("internal: NML/unfreed scan restarting\n");
        mwFlush();
        if ((mwHead == (mwData *)0x0) || (bVar4 = 1 < uVar2, uVar2 = uVar2 + 1, bVar4))
        goto LAB_0010640b;
      }
      mwFlushingB2 = 0;
      mwFlushingB1 = 0;
      mwFlushing = 0;
      if ((mwHead->flag & 1) == 0) {
        mwErrors = mwErrors + 1;
        pmVar10 = mwHead + 1;
        if (mwDataSize == '\0') {
          pmVar10 = mwHead;
        }
        ppmVar1 = &pmVar10->next;
        mwWrite("unfreed: <%ld> %s(%d), %ld bytes at %p ",mwHead->count,mwHead->file,
                (ulong)(uint)mwHead->line,mwHead->size,ppmVar1);
        lVar6 = 0;
        do {
          if (*(uchar *)((long)&pmVar10->prev + lVar6) != "mEmwAtch"[lVar6]) {
            mwWrite("[underflowed] ");
            mwFlush();
            break;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
        lVar6 = 0;
        do {
          if (*(uchar *)((long)ppmVar1 + lVar6 + mwHead->size) != "mEmwAtch"[lVar6]) {
            mwWrite("[overflowed] ");
            mwFlush();
            break;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
        mwWrite(" \t{");
        uVar14 = mwHead->size;
        uVar11 = 0x10;
        if (uVar14 < 0x10) {
          uVar11 = uVar14;
        }
        uVar16 = 0;
        do {
          if (uVar16 < uVar11) {
            mwWrite("%02X ",(ulong)*(byte *)((long)ppmVar1 + uVar16));
          }
          else {
            mwWrite(".. ");
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != 0x10);
        if (uVar14 != 0) {
          uVar14 = 0;
          do {
            cVar15 = '.';
            if (0xa0 < (byte)(*(char *)((long)ppmVar1 + uVar14) + 0x81U)) {
              cVar15 = *(char *)((long)ppmVar1 + uVar14);
            }
            mwWrite("%c",(ulong)(uint)(int)cVar15);
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
        }
        mwWrite("}\n");
        iVar5 = 0x25f;
      }
      else {
        pmVar10 = mwHead + 1;
        if (mwDataSize == '\0') {
          pmVar10 = mwHead;
        }
        sVar7 = mwHead->size;
        if ((int)sVar7 != 0) {
          lVar6 = 0;
          do {
            if (*(char *)((long)&pmVar10->next + lVar6) != -4) {
              mwErrors = mwErrors + 1;
              mwWrite("wild pointer: <%ld> NoMansLand %p alloc\'d at %s(%d)\n",mwHead->count,
                      &pmVar10->file,mwHead->file,(ulong)(uint)mwHead->line);
              mwFlush();
              sVar7 = mwHead->size;
              break;
            }
            lVar6 = lVar6 + 1;
          } while ((int)sVar7 != (int)lVar6);
        }
        mwNmlNumAlloc = mwNmlNumAlloc + -1;
        mwNmlCurAlloc = mwNmlCurAlloc - sVar7;
        iVar5 = 0x26c;
      }
      pmVar10 = mwHead;
      mwUnlink(mwHead,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/memwatch.c",
               iVar5);
      free(pmVar10);
    } while (mwHead != (mwData *)0x0);
  }
LAB_0010640b:
  if (mwNmlNumAlloc != 0) {
    mwWrite("internal: NoMansLand block counter %ld, not zero\n");
  }
  if (mwNmlCurAlloc != 0) {
    mwWrite("internal: NoMansLand byte counter %ld, not zero\n");
  }
  mwWrite("\nMemory usage statistics (global):\n");
  mwWrite(" N)umber of allocations made: %ld\n",mwStatNumAlloc);
  mwWrite(" L)argest memory usage      : %ld\n",mwStatMaxAlloc);
  mwWrite(" T)otal of all alloc() calls: %ld\n",mwStatTotAlloc);
  mwWrite(" U)nfreed bytes totals      : %ld\n",mwStatCurAlloc);
  mwFlush();
  if (0 < mwStatLevel) {
    mwWrite("\nMemory usage statistics (detailed):\n");
    mwWrite(" Module/Line                                Number   Largest  Total    Unfreed \n");
    for (pmVar13 = mwStatList; pmVar13 != (mwStat *)0x0; pmVar13 = pmVar13->next) {
      if (pmVar13->line == -1) {
        pcVar17 = "<unknown>";
        if (pmVar13->file != (char *)0x0) {
          iVar5 = mwIsReadAddr(pmVar13->file,0x16);
          pcVar17 = "<unknown>";
          if (iVar5 != 0) {
            pcVar17 = pmVar13->file;
          }
        }
        sVar8 = strlen(pcVar17);
        pcVar12 = pcVar17 + ((ulong)((uint)sVar8 & 0x7fffffff) - 0x2a);
        if ((int)(uint)sVar8 < 0x2b) {
          pcVar12 = pcVar17;
        }
        mwWrite(" %-42s %-8ld %-8ld %-8ld %-8ld\n",pcVar12,pmVar13->num,pmVar13->max,pmVar13->total,
                pmVar13->curr);
        pmVar18 = mwStatList;
        if ((mwStatList != (mwStat *)0x0 && pmVar13->file != (char *)0x0) && 1 < mwStatLevel) {
          do {
            uVar2 = pmVar18->line;
            if ((uVar2 != 0xffffffff) && (pcVar17 = pmVar18->file, pcVar17 != (char *)0x0)) {
              pcVar12 = pmVar13->file;
              if ((pcVar12 != (char *)0x0) && (cVar15 = *pcVar17, cVar15 != '\0')) {
                pp_Var9 = __ctype_toupper_loc();
                lVar6 = 0;
                do {
                  if ((*pp_Var9)[pcVar12[lVar6]] != (*pp_Var9)[cVar15]) goto LAB_001065e7;
                  cVar15 = pcVar17[lVar6 + 1];
                  lVar6 = lVar6 + 1;
                } while (cVar15 != '\0');
              }
              mwWrite("  %-8d                                  %-8ld %-8ld %-8ld %-8ld\n",
                      (ulong)uVar2,pmVar18->num,pmVar18->max,pmVar18->total,pmVar18->curr);
            }
LAB_001065e7:
            pmVar18 = pmVar18->next;
          } while (pmVar18 != (mwStat *)0x0);
        }
      }
    }
  }
  mwFlush();
  mwInited = 0;
  mwTail = (mwData *)0x0;
  mwHead = (mwData *)0x0;
  if (mwErrors != 0) {
    fprintf(_stderr,"MEMWATCH detected %ld anomalies\n");
  }
  mwLogFile((char *)0x0);
  mwErrors = 0;
  return;
}

Assistant:

void mwAbort(void)
{
	mwData *mw;
	mwMarker *mrk;
	char *data;
	time_t tid;
	int c, i, j;
	int errors;

	tid = time(NULL);
	mwWrite("\nStopped at %s\n", ctime(&tid));

	if (!mwInited) {
		mwWrite("internal: mwAbort(): MEMWATCH not initialized!\n");
	}

	/* release the grab list */
	mwDropAll();

	/* report mwMarked items */
	while (mwFirstMark) {
		mrk = mwFirstMark->next;
		mwWrite("mark: %p: %s\n", mwFirstMark->host, mwFirstMark->text);
		free(mwFirstMark->text);
		free(mwFirstMark);
		mwFirstMark = mrk;
		mwErrors ++;
	}

	/* release all still allocated memory */
	errors = 0;
	while (mwHead != NULL && errors < 3) {
		if (!mwIsOwned(mwHead, __FILE__, __LINE__)) {
			if (errors < 3) {
				errors ++;
				mwWrite("internal: NML/unfreed scan restarting\n");
				FLUSH();
				mwHead = mwHead;
				continue;
			}
			mwWrite("internal: NML/unfreed scan aborted, heap too damaged\n");
			FLUSH();
			break;
		}
		mwFlushW(0);
		if (!(mwHead->flag & MW_NML)) {
			mwErrors++;
			data = ((char *)mwHead) + mwDataSize;
			mwWrite("unfreed: <%ld> %s(%d), %ld bytes at %p ",
					mwHead->count, mwHead->file, mwHead->line, (long)mwHead->size, data + mwOverflowZoneSize);
			if (mwCheckOF(data)) {
				mwWrite("[underflowed] ");
				FLUSH();
			}
			if (mwCheckOF((data + mwOverflowZoneSize + mwHead->size))) {
				mwWrite("[overflowed] ");
				FLUSH();
			}
			mwWrite(" \t{");
			j = 16;
			if (mwHead->size < 16) {
				j = (int) mwHead->size;
			}
			for (i = 0; i < 16; i++) {
				if (i < j) mwWrite("%02X ",
									   (unsigned char) * (data + mwOverflowZoneSize + i));
				else {
					mwWrite(".. ");
				}
			}
			for (i = 0; i < j; i++) {
				c = *(data + mwOverflowZoneSize + i);
				if (c < 32 || c > 126) {
					c = '.';
				}
				mwWrite("%c", c);
			}
			mwWrite("}\n");
			mw = mwHead;
			mwUnlink(mw, __FILE__, __LINE__);
			free(mw);
		} else {
			data = ((char *)mwHead) + mwDataSize + mwOverflowZoneSize;
			if (mwTestMem(data, mwHead->size, MW_VAL_NML)) {
				mwErrors++;
				mwWrite("wild pointer: <%ld> NoMansLand %p alloc'd at %s(%d)\n",
						mwHead->count, data + mwOverflowZoneSize, mwHead->file, mwHead->line);
				FLUSH();
			}
			mwNmlNumAlloc --;
			mwNmlCurAlloc -= mwHead->size;
			mw = mwHead;
			mwUnlink(mw, __FILE__, __LINE__);
			free(mw);
		}
	}

	if (mwNmlNumAlloc) {
		mwWrite("internal: NoMansLand block counter %ld, not zero\n", mwNmlNumAlloc);
	}
	if (mwNmlCurAlloc) {
		mwWrite("internal: NoMansLand byte counter %ld, not zero\n", mwNmlCurAlloc);
	}

	/* report statistics */
	mwStatReport();
	FLUSH();

	mwInited = 0;
	mwHead = mwTail = NULL;
	if (mwErrors) {
		fprintf(mwSTDERR, "MEMWATCH detected %ld anomalies\n", mwErrors);
	}
	mwLogFile(NULL);
	mwErrors = 0;

	MW_MUTEX_TERM();

}